

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

QString * constRefArg(QByteArray *arg)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QAnyStringView s;
  bool bVar1;
  QAnyStringView *in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  ArgBase *argBases [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 a;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  char *pcVar2;
  char local_f0 [16];
  QLatin1StringView local_e0;
  QLatin1StringView local_d0;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_70 [24];
  qsizetype local_58;
  char *local_50;
  ulong local_48;
  ArgBase **local_40;
  ulong local_38;
  ArgBase **local_30;
  ulong local_28;
  ArgBase **local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  this = in_RDI;
  bVar1 = QByteArray::startsWith((QByteArray *)in_RDI.m_data,in_RDI._7_1_);
  if (bVar1) {
    local_e0 = Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)a);
    QLatin1String::QLatin1String((QLatin1String *)this.m_data,(QByteArray *)in_RSI);
    pcVar2 = local_f0;
    local_58 = local_e0.m_size;
    local_50 = local_e0.m_data;
    str.m_data = pcVar2;
    str.m_size = (qsizetype)this.m_data;
    QAnyStringView::QAnyStringView(in_RSI,str);
    local_90 = *(undefined8 *)pcVar2;
    local_88 = *(undefined8 *)(pcVar2 + 8);
    str_00.m_data = pcVar2;
    str_00.m_size = (qsizetype)this.m_data;
    QAnyStringView::QAnyStringView(in_RSI,str_00);
    s.m_size = (size_t)pcVar2;
    s.field_0.m_data = this.m_data;
    QtPrivate::qStringLikeToArg(s);
    local_28 = local_48;
    local_20 = local_40;
    local_18 = local_70;
    local_10 = 0;
    local_38 = local_48;
    local_30 = local_40;
    QtPrivate::argToQString((QAnyStringView *)in_RDI.m_data_utf8,local_48,local_40);
  }
  else {
    QLatin1String::QLatin1String((QLatin1String *)this.m_data,(QByteArray *)in_RSI);
    local_d0 = Qt::Literals::StringLiterals::operator____L1((char *)in_RSI,(size_t)a);
    operator+((QLatin1String *)a.m_data,(QLatin1String *)in_RDI.m_data);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QLatin1String> *)in_RDI.m_data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)a.m_data;
  }
  __stack_chk_fail();
}

Assistant:

static QString constRefArg(const QByteArray &arg)
{
    if (!arg.startsWith('Q'))
        return QLatin1StringView(arg) + " "_L1;
    else
        return "const %1 &"_L1.arg(QLatin1StringView(arg));
}